

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O3

void __thiscall CGlyphMap::CGlyphMap(CGlyphMap *this,IGraphics *pGraphics,FT_Library FtLibrary)

{
  array<vector3_base<int>,_allocator_default<vector3_base<int>_>_> *this_00;
  long lVar1;
  
  this->m_aTextures[0] = -1;
  this->m_aTextures[1] = -1;
  this_00 = &this->m_aAtlasPages[0].m_Sections;
  lVar1 = -0x18;
  do {
    this_00->list = (vector3_base<int> *)0x0;
    array<vector3_base<int>,_allocator_default<vector3_base<int>_>_>::clear(this_00);
    *(undefined8 *)((long)&this_00[2].list + 4) = 0;
    lVar1 = lVar1 + -0x30;
    this_00 = this_00 + 3;
  } while (lVar1 != -0x318);
  (this->m_Glyphs).super_array<CGlyphIndex,_allocator_default<CGlyphIndex>_>.list =
       (CGlyphIndex *)0x0;
  array<CGlyphIndex,_allocator_default<CGlyphIndex>_>::clear
            (&(this->m_Glyphs).super_array<CGlyphIndex,_allocator_default<CGlyphIndex>_>);
  this->m_pGraphics = pGraphics;
  FT_Stroker_New(FtLibrary,&this->m_FtStroker);
  this->m_DefaultFace = (FT_Face_conflict)0x0;
  this->m_VariantFace = (FT_Face_conflict)0x0;
  mem_zero(this->m_aFallbackFaces,0x80);
  mem_zero(this->m_aFtFaces,0x80);
  this->m_NumFtFaces = 0;
  this->m_NumFallbackFaces = 0;
  this->m_NumTotalPages = 0;
  InitTexture(this,0x800,0x800);
  return;
}

Assistant:

CGlyphMap::CGlyphMap(IGraphics *pGraphics, FT_Library FtLibrary)
{
	m_pGraphics = pGraphics;

	FT_Stroker_New(FtLibrary, &m_FtStroker);

	m_DefaultFace = NULL;
	m_VariantFace = NULL;

	mem_zero(m_aFallbackFaces, sizeof(m_aFallbackFaces));
	mem_zero(m_aFtFaces, sizeof(m_aFtFaces));

	m_NumFtFaces = 0;
	m_NumFallbackFaces = 0;
	m_NumTotalPages = 0;

	InitTexture(TEXTURE_SIZE, TEXTURE_SIZE);
}